

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

SessionSpecial * ssh_get_specials(Backend *be)

{
  BackendVtable *pBVar1;
  ssh_add_special_ctx *ctx;
  Interactor *local_28;
  size_t sStack_20;
  size_t local_18;
  
  local_28 = (Interactor *)0x0;
  sStack_20 = 0;
  local_18 = 0;
  pBVar1 = be[0x19].vt;
  if (pBVar1 != (BackendVtable *)0x0) {
    (**(code **)(pBVar1->init + 0x10))(pBVar1,ssh_add_special,&local_28);
    if (local_28 != (Interactor *)0x0) {
      local_28 = (Interactor *)safegrowarray(local_28,&local_18,0x10,sStack_20,1,false);
      (&local_28->vt)[sStack_20 * 2] = (InteractorVtable *)0x0;
      (&local_28->parent)[sStack_20 * 2] = (Interactor *)0x20;
      sStack_20 = sStack_20 + 1;
    }
  }
  safefree(be[3].interactor);
  be[3].interactor = local_28;
  return (SessionSpecial *)local_28;
}

Assistant:

static const SessionSpecial *ssh_get_specials(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);

    /*
     * Ask all our active protocol layers what specials they've got,
     * and amalgamate the list into one combined one.
     */

    struct ssh_add_special_ctx ctx[1];

    ctx->specials = NULL;
    ctx->nspecials = ctx->specials_size = 0;

    if (ssh->base_layer)
        ssh_ppl_get_specials(ssh->base_layer, ssh_add_special, ctx);

    if (ctx->specials) {
        /* If the list is non-empty, terminate it with a SS_EXITMENU. */
        ssh_add_special(ctx, NULL, SS_EXITMENU, 0);
    }

    sfree(ssh->specials);
    ssh->specials = ctx->specials;
    return ssh->specials;
}